

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_draw_sphere_ex(rf_vec3 center_pos,float radius,int rings,int slices,rf_color color)

{
  _Bool _Var1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 local_48;
  rf_int j;
  rf_int i;
  int num_vertex;
  int slices_local;
  int rings_local;
  float radius_local;
  rf_color color_local;
  undefined4 local_14;
  undefined4 uStack_10;
  rf_vec3 center_pos_local;
  
  _Var1 = rf_gfx_check_buffer_limit((rings + 2) * slices * 6);
  if (_Var1) {
    rf_gfx_draw();
  }
  rf_gfx_push_matrix();
  local_14 = center_pos.x;
  uStack_10 = center_pos.y;
  rf_gfx_translatef(local_14,uStack_10,center_pos.z);
  rf_gfx_scalef(radius,radius,radius);
  rf_gfx_begin(RF_TRIANGLES);
  rings_local._0_1_ = color.r;
  rings_local._1_1_ = color.g;
  rings_local._2_1_ = color.b;
  rings_local._3_1_ = color.a;
  rf_gfx_color4ub((uchar)rings_local,rings_local._1_1_,rings_local._2_1_,rings_local._3_1_);
  for (j = 0; j < rings + 2; j = j + 1) {
    for (local_48 = 0; local_48 < slices; local_48 = local_48 + 1) {
      fVar2 = cosf((float)((int)(0xb4 / (long)(rings + 1)) * j + 0x10e) * 0.017453292);
      fVar3 = sinf((float)((local_48 * 0x168) / (long)slices) * 0.017453292);
      fVar4 = sinf((float)((int)(0xb4 / (long)(rings + 1)) * j + 0x10e) * 0.017453292);
      fVar5 = cosf((float)((int)(0xb4 / (long)(rings + 1)) * j + 0x10e) * 0.017453292);
      fVar6 = cosf((float)((local_48 * 0x168) / (long)slices) * 0.017453292);
      rf_gfx_vertex3f(fVar2 * fVar3,fVar4,fVar5 * fVar6);
      fVar2 = cosf((float)((long)(int)(0xb4 / (long)(rings + 1)) * (j + 1) + 0x10e) * 0.017453292);
      fVar3 = sinf((float)(((local_48 + 1) * 0x168) / (long)slices) * 0.017453292);
      fVar4 = sinf((float)((long)(int)(0xb4 / (long)(rings + 1)) * (j + 1) + 0x10e) * 0.017453292);
      fVar5 = cosf((float)((long)(int)(0xb4 / (long)(rings + 1)) * (j + 1) + 0x10e) * 0.017453292);
      fVar6 = cosf((float)(((local_48 + 1) * 0x168) / (long)slices) * 0.017453292);
      rf_gfx_vertex3f(fVar2 * fVar3,fVar4,fVar5 * fVar6);
      fVar2 = cosf((float)((long)(int)(0xb4 / (long)(rings + 1)) * (j + 1) + 0x10e) * 0.017453292);
      fVar3 = sinf((float)((local_48 * 0x168) / (long)slices) * 0.017453292);
      fVar4 = sinf((float)((long)(int)(0xb4 / (long)(rings + 1)) * (j + 1) + 0x10e) * 0.017453292);
      fVar5 = cosf((float)((long)(int)(0xb4 / (long)(rings + 1)) * (j + 1) + 0x10e) * 0.017453292);
      fVar6 = cosf((float)((local_48 * 0x168) / (long)slices) * 0.017453292);
      rf_gfx_vertex3f(fVar2 * fVar3,fVar4,fVar5 * fVar6);
      fVar2 = cosf((float)((int)(0xb4 / (long)(rings + 1)) * j + 0x10e) * 0.017453292);
      fVar3 = sinf((float)((local_48 * 0x168) / (long)slices) * 0.017453292);
      fVar4 = sinf((float)((int)(0xb4 / (long)(rings + 1)) * j + 0x10e) * 0.017453292);
      fVar5 = cosf((float)((int)(0xb4 / (long)(rings + 1)) * j + 0x10e) * 0.017453292);
      fVar6 = cosf((float)((local_48 * 0x168) / (long)slices) * 0.017453292);
      rf_gfx_vertex3f(fVar2 * fVar3,fVar4,fVar5 * fVar6);
      fVar2 = cosf((float)((int)(0xb4 / (long)(rings + 1)) * j + 0x10e) * 0.017453292);
      fVar3 = sinf((float)(((local_48 + 1) * 0x168) / (long)slices) * 0.017453292);
      fVar4 = sinf((float)((int)(0xb4 / (long)(rings + 1)) * j + 0x10e) * 0.017453292);
      fVar5 = cosf((float)((int)(0xb4 / (long)(rings + 1)) * j + 0x10e) * 0.017453292);
      fVar6 = cosf((float)(((local_48 + 1) * 0x168) / (long)slices) * 0.017453292);
      rf_gfx_vertex3f(fVar2 * fVar3,fVar4,fVar5 * fVar6);
      fVar2 = cosf((float)((long)(int)(0xb4 / (long)(rings + 1)) * (j + 1) + 0x10e) * 0.017453292);
      fVar3 = sinf((float)(((local_48 + 1) * 0x168) / (long)slices) * 0.017453292);
      fVar4 = sinf((float)((long)(int)(0xb4 / (long)(rings + 1)) * (j + 1) + 0x10e) * 0.017453292);
      fVar5 = cosf((float)((long)(int)(0xb4 / (long)(rings + 1)) * (j + 1) + 0x10e) * 0.017453292);
      fVar6 = cosf((float)(((local_48 + 1) * 0x168) / (long)slices) * 0.017453292);
      rf_gfx_vertex3f(fVar2 * fVar3,fVar4,fVar5 * fVar6);
    }
  }
  rf_gfx_end();
  rf_gfx_pop_matrix();
  return;
}

Assistant:

RF_API void rf_draw_sphere_ex(rf_vec3 center_pos, float radius, int rings, int slices, rf_color color)
{
    int num_vertex = (rings + 2)*slices*6;
    if (rf_gfx_check_buffer_limit(num_vertex)) rf_gfx_draw();

    rf_gfx_push_matrix();
    // NOTE: Transformation is applied in inverse order (scale -> translate)
    rf_gfx_translatef(center_pos.x, center_pos.y, center_pos.z);
    rf_gfx_scalef(radius, radius, radius);

    rf_gfx_begin(RF_TRIANGLES);
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);

    for (rf_int i = 0; i < (rings + 2); i++)
    {
        for (rf_int j = 0; j < slices; j++)
        {
            rf_gfx_vertex3f(cosf(RF_DEG2RAD*(270+(180/(rings + 1))*i))*sinf(RF_DEG2RAD*(j * 360/slices)),
                           sinf(RF_DEG2RAD*(270+(180/(rings + 1))*i)),
                           cosf(RF_DEG2RAD*(270+(180/(rings + 1))*i))*cosf(RF_DEG2RAD*(j * 360/slices)));
            rf_gfx_vertex3f(cosf(RF_DEG2RAD*(270+(180/(rings + 1))*(i+1)))*sinf(RF_DEG2RAD*((j+1) * 360/slices)),
                           sinf(RF_DEG2RAD*(270+(180/(rings + 1))*(i+1))),
                           cosf(RF_DEG2RAD*(270+(180/(rings + 1))*(i+1)))*cosf(RF_DEG2RAD*((j+1) * 360/slices)));
            rf_gfx_vertex3f(cosf(RF_DEG2RAD*(270+(180/(rings + 1))*(i+1)))*sinf(RF_DEG2RAD*(j * 360/slices)),
                           sinf(RF_DEG2RAD*(270+(180/(rings + 1))*(i+1))),
                           cosf(RF_DEG2RAD*(270+(180/(rings + 1))*(i+1)))*cosf(RF_DEG2RAD*(j * 360/slices)));

            rf_gfx_vertex3f(cosf(RF_DEG2RAD*(270+(180/(rings + 1))*i))*sinf(RF_DEG2RAD*(j * 360/slices)),
                           sinf(RF_DEG2RAD*(270+(180/(rings + 1))*i)),
                           cosf(RF_DEG2RAD*(270+(180/(rings + 1))*i))*cosf(RF_DEG2RAD*(j * 360/slices)));
            rf_gfx_vertex3f(cosf(RF_DEG2RAD*(270+(180/(rings + 1))*(i)))*sinf(RF_DEG2RAD*((j+1) * 360/slices)),
                           sinf(RF_DEG2RAD*(270+(180/(rings + 1))*(i))),
                           cosf(RF_DEG2RAD*(270+(180/(rings + 1))*(i)))*cosf(RF_DEG2RAD*((j+1) * 360/slices)));
            rf_gfx_vertex3f(cosf(RF_DEG2RAD*(270+(180/(rings + 1))*(i+1)))*sinf(RF_DEG2RAD*((j+1) * 360/slices)),
                           sinf(RF_DEG2RAD*(270+(180/(rings + 1))*(i+1))),
                           cosf(RF_DEG2RAD*(270+(180/(rings + 1))*(i+1)))*cosf(RF_DEG2RAD*((j+1) * 360/slices)));
        }
    }
    rf_gfx_end();
    rf_gfx_pop_matrix();
}